

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O1

Vec_Vec_t * Vec_VecDupInt(Vec_Vec_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Vec_t *pVVar4;
  void **ppvVar5;
  int *piVar6;
  void *__dest;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  iVar2 = p->nSize;
  pVVar4 = (Vec_Vec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar2 - 1U) {
    iVar7 = iVar2;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (0 < p->nSize) {
    uVar8 = pVVar4->nCap;
    iVar2 = pVVar4->nSize;
    ppvVar5 = pVVar4->pArray;
    lVar10 = 0;
    do {
      pvVar3 = p->pArray[lVar10];
      piVar6 = (int *)malloc(0x10);
      iVar7 = *(int *)((long)pvVar3 + 4);
      lVar9 = (long)iVar7;
      piVar6[1] = iVar7;
      *piVar6 = iVar7;
      if (lVar9 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(lVar9 * 4);
      }
      *(void **)(piVar6 + 2) = __dest;
      memcpy(__dest,*(void **)((long)pvVar3 + 8),lVar9 << 2);
      if (iVar2 + (int)lVar10 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (ppvVar5 == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(ppvVar5,0x80);
          }
          uVar8 = 0x10;
        }
        else {
          uVar1 = uVar8 * 2;
          if (SBORROW4(uVar8,uVar1) != 0 < (int)uVar8) {
            uVar8 = uVar1;
            if (ppvVar5 == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 3);
            }
            else {
              ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar1 << 3);
            }
          }
        }
      }
      ppvVar5[iVar2 + lVar10] = piVar6;
      lVar10 = lVar10 + 1;
    } while (lVar10 < p->nSize);
    pVVar4->nSize = iVar2 + (int)lVar10;
    pVVar4->nCap = uVar8;
    pVVar4->pArray = ppvVar5;
  }
  return pVVar4;
}

Assistant:

static inline Vec_Vec_t * Vec_VecDupInt( Vec_Vec_t * p )
{
    Vec_Ptr_t * vNew;
    Vec_Int_t * vVec;
    int i;
    vNew = Vec_PtrAlloc( Vec_VecSize(p) );
    Vec_VecForEachLevelInt( p, vVec, i )
        Vec_PtrPush( vNew, Vec_IntDup(vVec) );
    return (Vec_Vec_t *)vNew;
}